

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_objects.cc
# Opt level: O2

QPDFObjGen __thiscall QPDF::nextObjGen(QPDF *this)

{
  int iVar1;
  QPDFObjGen QVar2;
  range_error *this_00;
  size_t local_18;
  
  local_18 = getObjectCount(this);
  iVar1 = QIntC::IntConverter<unsigned_long,_int,_false,_true>::convert(&local_18);
  if (iVar1 != 0x7fffffff) {
    QVar2.obj = iVar1 + 1;
    QVar2.gen = 0;
    return QVar2;
  }
  this_00 = (range_error *)__cxa_allocate_exception(0x10);
  std::range_error::range_error(this_00,"max object id is too high to create new objects");
  __cxa_throw(this_00,&std::range_error::typeinfo,std::range_error::~range_error);
}

Assistant:

QPDFObjGen
QPDF::nextObjGen()
{
    int max_objid = toI(getObjectCount());
    if (max_objid == std::numeric_limits<int>::max()) {
        throw std::range_error("max object id is too high to create new objects");
    }
    return QPDFObjGen(max_objid + 1, 0);
}